

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_display_keylog(command *cmd)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  wchar_t row;
  char buf2 [12];
  char buf [50];
  undefined1 local_98 [9];
  undefined1 auStack_8f [7];
  undefined8 local_88;
  char local_74 [12];
  char local_68 [56];
  
  local_98._0_4_ = EVT_NONE;
  local_98._4_4_ = 0;
  stack0xffffffffffffff70 = 0;
  local_88 = 0;
  screen_save();
  prt("Previous keypresses (top most recent):",L'\0',L'\0');
  row = L'\0';
  do {
    if (row < log_size) {
      iVar3 = ((uint)(log_i <= row) * 8 - 1 ^ row) + log_i;
      uVar2 = keylog[iVar3].code;
      bVar1 = keylog[iVar3].mods;
      local_98._4_4_ = uVar2;
      local_98._0_4_ = keylog[iVar3].type;
      stack0xffffffffffffff70 =
           CONCAT71(CONCAT52(CONCAT41(auStack_8f._3_4_,keylog[iVar3].field_0xb),
                             *(undefined2 *)&keylog[iVar3].field_0x9),bVar1);
      keypress_to_text(local_74,0xc,(keypress *)local_98,true);
      strnfmt(local_68,0x32,"    %-12s (code=%lu mods=%u)",local_74,(ulong)uVar2,(ulong)bVar1);
    }
    else {
      strnfmt(local_68,0x32,"%40s","");
    }
    row = row + L'\x01';
    prt(local_68,row,L'\0');
  } while (row != L'\b');
  prt("Press any key to continue.",L'\t',L'\0');
  anykey();
  screen_load();
  return;
}

Assistant:

void do_cmd_wiz_display_keylog(struct command *cmd)
{
	int i;
	char buf[50];
	char buf2[12];
	struct keypress keys[2] = {KEYPRESS_NULL, KEYPRESS_NULL};

	screen_save();

	prt("Previous keypresses (top most recent):", 0, 0);

	for (i = 0; i < KEYLOG_SIZE; i++) {
		if (i < log_size) {
			/*
			 * Find the keypress from the log; log_i is one past
			 * the most recent.
			 */
			int j = (log_i > i) ?
				log_i - i - 1 : log_i - i - 1 + KEYLOG_SIZE;
			struct keypress k = keylog[j];

			/*
			 * ugh. it would be nice if there was a version of
			 * keypress_to_text which took only one keypress.
			 */
			keys[0] = k;
			keypress_to_text(buf2, sizeof(buf2), keys, true);

			/* format this line of output */
			strnfmt(buf, sizeof(buf), "    %-12s (code=%lu mods=%u)",
				buf2, (unsigned long)k.code, k.mods);
		} else {
			/* create a blank line of output */
			strnfmt(buf, sizeof(buf), "%40s", "");
		}

		prt(buf, i + 1, 0);
	}

	prt("Press any key to continue.", KEYLOG_SIZE + 1, 0);
	anykey();
	screen_load();
}